

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

int __thiscall embree::Token::Int(Token *this)

{
  runtime_error *this_00;
  int *in_RDI;
  ParseLocation *in_stack_00000048;
  undefined3 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffac;
  string local_28 [40];
  
  if (*in_RDI == 2) {
    return in_RDI[1];
  }
  uVar1 = CONCAT13(1,in_stack_ffffffffffffffa8);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(in_stack_00000048);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffac,uVar1),(char *)in_RDI);
  std::runtime_error::runtime_error(this_00,local_28);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Int() const {
      if (ty == TY_INT) return i;
      THROW_RUNTIME_ERROR(loc.str()+": integer expected");
    }